

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoundMap.cpp
# Opt level: O2

vector<AI::SoundWave,_std::allocator<AI::SoundWave>_> * __thiscall
AI::SoundMap::collectSounds
          (vector<AI::SoundWave,_std::allocator<AI::SoundWave>_> *__return_storage_ptr__,
          SoundMap *this,Vector2<float> position,int range)

{
  uint uVar1;
  int iVar2;
  Vector2<int> VVar3;
  __normal_iterator<AI::SoundWave_*,_std::vector<AI::SoundWave,_std::allocator<AI::SoundWave>_>_>
  __first;
  int iVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  bool bVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  
  (__return_storage_ptr__->super__Vector_base<AI::SoundWave,_std::allocator<AI::SoundWave>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<AI::SoundWave,_std::allocator<AI::SoundWave>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<AI::SoundWave,_std::allocator<AI::SoundWave>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  VVar3 = calcGridCoordinates(position,this->resolution,this->gridSize);
  iVar4 = range / 2;
  fVar9 = Math::clamp((float)(VVar3.x - iVar4),0.0,(float)(this->gridSize).x);
  fVar10 = Math::clamp((float)(iVar4 + VVar3.x),0.0,(float)(this->gridSize).x);
  fVar11 = Math::clamp((float)(VVar3.y - iVar4),0.0,(float)(this->gridSize).y);
  fVar12 = Math::clamp((float)(iVar4 + VVar3.y),0.0,(float)(this->gridSize).y);
  iVar4 = (int)fVar11;
  while( true ) {
    lVar6 = (long)(int)fVar9;
    if (fVar12 <= (float)iVar4) break;
    for (; (float)(int)lVar6 < fVar10; lVar6 = lVar6 + 1) {
      iVar2 = (this->gridSize).x * iVar4;
      uVar1 = (this->grid).super__Vector_base<AI::Cell,_std::allocator<AI::Cell>_>._M_impl.
              super__Vector_impl_data._M_start[iVar2 + (int)lVar6].numberOfWaves;
      if ((int)uVar1 < 1) {
        uVar1 = 0;
      }
      uVar7 = (ulong)uVar1;
      lVar5 = (iVar2 + lVar6) * 0x13c + 4;
      while (bVar8 = uVar7 != 0, uVar7 = uVar7 - 1, bVar8) {
        std::vector<AI::SoundWave,_std::allocator<AI::SoundWave>_>::push_back
                  (__return_storage_ptr__,
                   (value_type *)
                   ((long)((this->grid).super__Vector_base<AI::Cell,_std::allocator<AI::Cell>_>.
                           _M_impl.super__Vector_impl_data._M_start)->intersectingWaves + lVar5 + -4
                   ));
        lVar5 = lVar5 + 0x1c;
      }
    }
    iVar4 = iVar4 + 1;
  }
  std::
  __sort<__gnu_cxx::__normal_iterator<AI::SoundWave*,std::vector<AI::SoundWave,std::allocator<AI::SoundWave>>>,__gnu_cxx::__ops::_Iter_less_iter>
            ((__return_storage_ptr__->
             super__Vector_base<AI::SoundWave,_std::allocator<AI::SoundWave>_>)._M_impl.
             super__Vector_impl_data._M_start,
             (__return_storage_ptr__->
             super__Vector_base<AI::SoundWave,_std::allocator<AI::SoundWave>_>)._M_impl.
             super__Vector_impl_data._M_finish);
  __first = std::
            __unique<__gnu_cxx::__normal_iterator<AI::SoundWave*,std::vector<AI::SoundWave,std::allocator<AI::SoundWave>>>,__gnu_cxx::__ops::_Iter_equal_to_iter>
                      ((__return_storage_ptr__->
                       super__Vector_base<AI::SoundWave,_std::allocator<AI::SoundWave>_>)._M_impl.
                       super__Vector_impl_data._M_start,
                       (__return_storage_ptr__->
                       super__Vector_base<AI::SoundWave,_std::allocator<AI::SoundWave>_>)._M_impl.
                       super__Vector_impl_data._M_finish);
  std::vector<AI::SoundWave,_std::allocator<AI::SoundWave>_>::erase
            (__return_storage_ptr__,(const_iterator)__first._M_current,
             (__return_storage_ptr__->
             super__Vector_base<AI::SoundWave,_std::allocator<AI::SoundWave>_>)._M_impl.
             super__Vector_impl_data._M_finish);
  return __return_storage_ptr__;
}

Assistant:

std::vector<SoundWave> SoundMap::collectSounds(Math::Vector2<float> position, int range) const
	{
		std::vector<SoundWave> waves;
		
		auto gridCoordinates = calcGridCoordinates(position, resolution, gridSize);

		auto minX = clamp(gridCoordinates.x - range / 2, 0, gridSize.x);
		auto maxX = clamp(gridCoordinates.x + range / 2, 0, gridSize.x);
		auto minY = clamp(gridCoordinates.y - range / 2, 0, gridSize.y);
		auto maxY = clamp(gridCoordinates.y + range / 2, 0, gridSize.y);

		for (int j = minY; j < maxY; j++)
		{
			for (int i = minX; i < maxX; i++)
			{
				auto index = i + j * gridSize.x;
				auto count = grid[index].numberOfWaves;

				for (int k = 0; k < count; k++)
				{
					waves.push_back(grid[index].intersectingWaves[k]);
				}
			}
		}

		std::sort(begin(waves), end(waves));
		waves.erase(std::unique(begin(waves), end(waves)), end(waves));

		return waves;
	}